

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void SyZero(void *pSrc,sxu32 nSize)

{
  uchar *puVar1;
  uchar *zEnd;
  uchar *zSrc;
  sxu32 nSize_local;
  void *pSrc_local;
  
  puVar1 = (uchar *)((long)pSrc + (ulong)nSize);
  zEnd = (uchar *)pSrc;
  while( true ) {
    if (puVar1 <= zEnd) {
      return;
    }
    *zEnd = '\0';
    if (puVar1 <= zEnd + 1) {
      return;
    }
    zEnd[1] = '\0';
    if (puVar1 <= zEnd + 2) {
      return;
    }
    zEnd[2] = '\0';
    if (puVar1 <= zEnd + 3) break;
    zEnd[3] = '\0';
    zEnd = zEnd + 4;
  }
  return;
}

Assistant:

JX9_PRIVATE void SyZero(void *pSrc, sxu32 nSize)
{
	register unsigned char *zSrc = (unsigned char *)pSrc;
	unsigned char *zEnd;
#if defined(UNTRUST)
	if( zSrc == 0 || nSize <= 0 ){
		return ;
	}
#endif
	zEnd = &zSrc[nSize];
	for(;;){
		if( zSrc >= zEnd ){break;} zSrc[0] = 0; zSrc++;
		if( zSrc >= zEnd ){break;} zSrc[0] = 0; zSrc++;
		if( zSrc >= zEnd ){break;} zSrc[0] = 0; zSrc++;
		if( zSrc >= zEnd ){break;} zSrc[0] = 0; zSrc++;
	}
}